

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5MergePrefixLists(Fts5Index *p,Fts5Buffer *p1,int nBuf,Fts5Buffer *aBuf)

{
  long lVar1;
  int iVar2;
  size_t __n;
  ulong uVar3;
  int *pRc;
  PrefixMerger *pPVar4;
  int iVar5;
  long lVar6;
  u8 *puVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  PrefixMerger *pThis;
  PrefixMerger *pPVar11;
  long in_FS_OFFSET;
  i64 iPrev;
  Fts5Buffer tmp;
  Fts5Buffer local_458;
  PrefixMerger *local_440;
  PrefixMerger aMerger [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(aMerger,0xaa,0x400);
  local_458.p = (u8 *)0x0;
  local_458.n = 0;
  local_458.nSpace = 0;
  tmp.p = (u8 *)0x0;
  tmp.n = 0;
  tmp.nSpace = 0;
  lVar6 = (long)nBuf;
  lVar8 = 0;
  __memset_chk(aMerger,0,lVar6 * 0x40 + 0x40,0x400);
  local_440 = aMerger + lVar6;
  fts5DoclistIterInit(p1,&local_440->iter);
  uVar3 = 0;
  if (0 < nBuf) {
    uVar3 = (ulong)(uint)nBuf;
  }
  iVar5 = 0;
  for (; uVar3 * 0x40 != lVar8; lVar8 = lVar8 + 0x40) {
    pPVar11 = (PrefixMerger *)((long)&aMerger[0].iter.aEof + lVar8);
    fts5DoclistIterInit(aBuf,(Fts5DoclistIter *)pPVar11);
    fts5PrefixMergerInsertByRowid(&local_440,pPVar11);
    iVar5 = iVar5 + aBuf->n;
    aBuf = aBuf + 1;
  }
  if (iVar5 != 0) {
    pRc = &p->rc;
    iVar5 = sqlite3Fts5BufferSize(pRc,&local_458,p1->n + nBuf * 10 + iVar5 + 9);
    if (iVar5 == 0) {
      lVar8 = 0;
      iVar5 = local_458.n;
      while( true ) {
        while( true ) {
          pPVar11 = local_440;
          puVar7 = local_458.p;
          if (local_440 == (PrefixMerger *)0x0) {
            local_458.n = iVar5;
            goto LAB_001cd709;
          }
          iVar2 = sqlite3Fts5PutVarint(local_458.p + iVar5,(local_440->iter).iRowid - lVar8);
          iVar5 = iVar2 + iVar5;
          lVar8 = (pPVar11->iter).iRowid;
          if ((pPVar11->pNext != (PrefixMerger *)0x0) && (lVar8 == (pPVar11->pNext->iter).iRowid))
          break;
          memcpy(puVar7 + iVar5,(pPVar11->iter).aPoslist,
                 (long)(pPVar11->iter).nSize + (long)(pPVar11->iter).nPoslist);
          iVar5 = iVar5 + (pPVar11->iter).nPoslist + (pPVar11->iter).nSize;
          fts5DoclistIterNext(&pPVar11->iter);
          local_440 = pPVar11->pNext;
          fts5PrefixMergerInsertByRowid(&local_440,pPVar11);
        }
        iPrev = 0;
        local_440 = (PrefixMerger *)0x0;
        iVar2 = 0;
        iVar9 = 8;
        while ((pPVar4 = local_440, pPVar11 != (PrefixMerger *)0x0 &&
               ((pPVar11->iter).iRowid == lVar8))) {
          pPVar4 = pPVar11->pNext;
          pPVar11->iOff = 0;
          pPVar11->iPos = 0;
          puVar7 = (pPVar11->iter).aPoslist + (pPVar11->iter).nSize;
          pPVar11->aPos = puVar7;
          sqlite3Fts5PoslistNext64(puVar7,(pPVar11->iter).nPoslist,&pPVar11->iOff,&pPVar11->iPos);
          iVar9 = iVar9 + (pPVar11->iter).nPoslist + 10;
          fts5PrefixMergerInsertByPosition(&local_440,pPVar11);
          iVar2 = iVar2 + 10;
          pPVar11 = pPVar4;
        }
        if ((local_440 == (PrefixMerger *)0x0) || (local_440->pNext == (PrefixMerger *)0x0)) {
          local_458.n = iVar5;
          goto LAB_001cd6e7;
        }
        iVar2 = sqlite3Fts5BufferSize(pRc,&tmp,iVar2 + iVar9);
        if (iVar2 != 0) {
          local_458.n = iVar5;
          goto LAB_001cd709;
        }
        tmp._8_8_ = tmp._8_8_ & 0xffffffff00000000;
        local_440 = pPVar4->pNext;
        sqlite3Fts5PoslistSafeAppend(&tmp,&iPrev,pPVar4->iPos);
        sqlite3Fts5PoslistNext64(pPVar4->aPos,(pPVar4->iter).nPoslist,&pPVar4->iOff,&pPVar4->iPos);
        while( true ) {
          fts5PrefixMergerInsertByPosition(&local_440,pPVar4);
          pPVar4 = local_440;
          lVar10 = local_440->iPos;
          if (local_440->pNext == (PrefixMerger *)0x0) break;
          if (lVar10 != iPrev) {
            sqlite3Fts5PoslistSafeAppend(&tmp,&iPrev,lVar10);
          }
          sqlite3Fts5PoslistNext64(pPVar4->aPos,(pPVar4->iter).nPoslist,&pPVar4->iOff,&pPVar4->iPos)
          ;
          local_440 = pPVar4->pNext;
        }
        if (lVar10 != iPrev) {
          sqlite3Fts5PoslistSafeAppend(&tmp,&iPrev,lVar10);
        }
        puVar7 = local_458.p;
        uVar3 = (long)(pPVar4->iter).nPoslist - (long)pPVar4->iOff;
        iVar2 = tmp.n;
        __n = (size_t)tmp.n;
        lVar10 = __n + uVar3;
        if (iVar9 + -8 < (int)lVar10) break;
        iVar9 = sqlite3Fts5PutVarint(local_458.p + iVar5,lVar10 * 2);
        memcpy(puVar7 + (iVar9 + iVar5),tmp.p,__n);
        iVar5 = iVar9 + iVar5 + iVar2;
        if (0 < (int)uVar3) {
          memcpy(puVar7 + iVar5,pPVar4->aPos + pPVar4->iOff,uVar3 & 0xffffffff);
          iVar5 = iVar5 + (int)uVar3;
        }
        pPVar4 = aMerger;
        local_440 = pPVar11;
        for (lVar10 = 0; lVar10 <= lVar6; lVar10 = lVar10 + 1) {
          if (((pPVar4->iter).aPoslist != (u8 *)0x0) && ((pPVar4->iter).iRowid == lVar8)) {
            fts5DoclistIterNext(&pPVar4->iter);
            fts5PrefixMergerInsertByRowid(&local_440,pPVar4);
          }
          pPVar4 = pPVar4 + 1;
        }
      }
      local_458.n = iVar5;
      if (*pRc == 0) {
LAB_001cd6e7:
        *pRc = 0x10b;
      }
LAB_001cd709:
      sqlite3Fts5BufferFree(p1);
      sqlite3Fts5BufferFree(&tmp);
      puVar7 = local_458.p + iVar5;
      puVar7[0] = '\0';
      puVar7[1] = '\0';
      puVar7[2] = '\0';
      puVar7[3] = '\0';
      puVar7[4] = '\0';
      puVar7[5] = '\0';
      puVar7[6] = '\0';
      puVar7[7] = '\0';
      p1->p = local_458.p;
      p1->n = local_458.n;
      p1->nSpace = local_458.nSpace;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts5MergePrefixLists(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Buffer *p1,                 /* First list to merge */
  int nBuf,                       /* Number of buffers in array aBuf[] */
  Fts5Buffer *aBuf                /* Other lists to merge in */
){
#define fts5PrefixMergerNextPosition(p) \
  sqlite3Fts5PoslistNext64((p)->aPos,(p)->iter.nPoslist,&(p)->iOff,&(p)->iPos)
#define FTS5_MERGE_NLIST 16
  PrefixMerger aMerger[FTS5_MERGE_NLIST];
  PrefixMerger *pHead = 0;
  int i;
  int nOut = 0;
  Fts5Buffer out = {0, 0, 0};
  Fts5Buffer tmp = {0, 0, 0};
  i64 iLastRowid = 0;

  /* Initialize a doclist-iterator for each input buffer. Arrange them in
  ** a linked-list starting at pHead in ascending order of rowid. Avoid
  ** linking any iterators already at EOF into the linked list at all. */
  assert( nBuf+1<=(int)(sizeof(aMerger)/sizeof(aMerger[0])) );
  memset(aMerger, 0, sizeof(PrefixMerger)*(nBuf+1));
  pHead = &aMerger[nBuf];
  fts5DoclistIterInit(p1, &pHead->iter);
  for(i=0; i<nBuf; i++){
    fts5DoclistIterInit(&aBuf[i], &aMerger[i].iter);
    fts5PrefixMergerInsertByRowid(&pHead, &aMerger[i]);
    nOut += aBuf[i].n;
  }
  if( nOut==0 ) return;
  nOut += p1->n + 9 + 10*nBuf;

  /* The maximum size of the output is equal to the sum of the
  ** input sizes + 1 varint (9 bytes). The extra varint is because if the
  ** first rowid in one input is a large negative number, and the first in
  ** the other a non-negative number, the delta for the non-negative
  ** number will be larger on disk than the literal integer value
  ** was.
  **
  ** Or, if the input position-lists are corrupt, then the output might
  ** include up to (nBuf+1) extra 10-byte positions created by interpreting -1
  ** (the value PoslistNext64() uses for EOF) as a position and appending
  ** it to the output. This can happen at most once for each input
  ** position-list, hence (nBuf+1) 10 byte paddings.  */
  if( sqlite3Fts5BufferSize(&p->rc, &out, nOut) ) return;

  while( pHead ){
    fts5MergeAppendDocid(&out, iLastRowid, pHead->iter.iRowid);

    if( pHead->pNext && iLastRowid==pHead->pNext->iter.iRowid ){
      /* Merge data from two or more poslists */
      i64 iPrev = 0;
      int nTmp = FTS5_DATA_ZERO_PADDING;
      int nMerge = 0;
      PrefixMerger *pSave = pHead;
      PrefixMerger *pThis = 0;
      int nTail = 0;

      pHead = 0;
      while( pSave && pSave->iter.iRowid==iLastRowid ){
        PrefixMerger *pNext = pSave->pNext;
        pSave->iOff = 0;
        pSave->iPos = 0;
        pSave->aPos = &pSave->iter.aPoslist[pSave->iter.nSize];
        fts5PrefixMergerNextPosition(pSave);
        nTmp += pSave->iter.nPoslist + 10;
        nMerge++;
        fts5PrefixMergerInsertByPosition(&pHead, pSave);
        pSave = pNext;
      }

      if( pHead==0 || pHead->pNext==0 ){
        p->rc = FTS5_CORRUPT;
        break;
      }

      /* See the earlier comment in this function for an explanation of why
      ** corrupt input position lists might cause the output to consume
      ** at most nMerge*10 bytes of unexpected space. */
      if( sqlite3Fts5BufferSize(&p->rc, &tmp, nTmp+nMerge*10) ){
        break;
      }
      fts5BufferZero(&tmp);

      pThis = pHead;
      pHead = pThis->pNext;
      sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, pThis->iPos);
      fts5PrefixMergerNextPosition(pThis);
      fts5PrefixMergerInsertByPosition(&pHead, pThis);

      while( pHead->pNext ){
        pThis = pHead;
        if( pThis->iPos!=iPrev ){
          sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, pThis->iPos);
        }
        fts5PrefixMergerNextPosition(pThis);
        pHead = pThis->pNext;
        fts5PrefixMergerInsertByPosition(&pHead, pThis);
      }

      if( pHead->iPos!=iPrev ){
        sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, pHead->iPos);
      }
      nTail = pHead->iter.nPoslist - pHead->iOff;

      /* WRITEPOSLISTSIZE */
      assert_nc( tmp.n+nTail<=nTmp );
      assert( tmp.n+nTail<=nTmp+nMerge*10 );
      if( tmp.n+nTail>nTmp-FTS5_DATA_ZERO_PADDING ){
        if( p->rc==SQLITE_OK ) p->rc = FTS5_CORRUPT;
        break;
      }
      fts5BufferSafeAppendVarint(&out, (tmp.n+nTail) * 2);
      fts5BufferSafeAppendBlob(&out, tmp.p, tmp.n);
      if( nTail>0 ){
        fts5BufferSafeAppendBlob(&out, &pHead->aPos[pHead->iOff], nTail);
      }

      pHead = pSave;
      for(i=0; i<nBuf+1; i++){
        PrefixMerger *pX = &aMerger[i];
        if( pX->iter.aPoslist && pX->iter.iRowid==iLastRowid ){
          fts5DoclistIterNext(&pX->iter);
          fts5PrefixMergerInsertByRowid(&pHead, pX);
        }
      }

    }else{
      /* Copy poslist from pHead to output */
      PrefixMerger *pThis = pHead;
      Fts5DoclistIter *pI = &pThis->iter;
      fts5BufferSafeAppendBlob(&out, pI->aPoslist, pI->nPoslist+pI->nSize);
      fts5DoclistIterNext(pI);
      pHead = pThis->pNext;
      fts5PrefixMergerInsertByRowid(&pHead, pThis);
    }
  }

  fts5BufferFree(p1);
  fts5BufferFree(&tmp);
  memset(&out.p[out.n], 0, FTS5_DATA_ZERO_PADDING);
  *p1 = out;
}